

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(data_view *data,DataType baseType,bool *val)

{
  double dVar1;
  string_view val_00;
  string_view val_01;
  bool bVar2;
  int iVar3;
  invalid_argument *this;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long val_1;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 uVar7;
  undefined8 uStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined8 local_28;
  __index_type local_20;
  
  if (0x18 < baseType) {
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)&stack0xffffffffffffffb8,(helics *)data,(data_view *)val);
      valueExtract((defV *)&stack0xffffffffffffffb8,val);
LAB_00201e5f:
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&stack0xffffffffffffffb8);
      return;
    }
    if (baseType == HELICS_ANY) {
      local_20 = '\0';
      valueExtract(data,HELICS_ANY,(defV *)&stack0xffffffffffffffb8);
      valueExtract((defV *)&stack0xffffffffffffffb8,val);
      goto LAB_00201e5f;
    }
    if (baseType == HELICS_CUSTOM) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"unrecognized helics type");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
switchD_00201dd5_default:
    uVar7 = 0.0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)&stack0xffffffffffffffb8)
    ;
    val_01._M_str = (char *)uVar7;
    val_01._M_len = 0x201f8a;
    bVar2 = helicsBoolValue(val_01);
LAB_00201f8a:
    *val = bVar2;
    return;
  }
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(double *)&stack0xffffffffffffffb8);
    goto LAB_00201eb4;
  case HELICS_INT:
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)&stack0xffffffffffffffb8);
    *val = (double)in_stack_ffffffffffffffb8 != 0.0;
    return;
  case HELICS_COMPLEX:
    uVar7 = 0.0;
    detail::convertFromBinary
              ((byte *)(data->dblock)._M_str,(complex<double> *)&stack0xffffffffffffffb8);
    in_stack_ffffffffffffffb8 = cabs((double)uVar7);
LAB_00201eb4:
    *val = (double)in_stack_ffffffffffffffb8 != 0.0;
    return;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffb8,data);
    dVar1 = vectorNorm((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffb8);
    uVar5 = SUB84(dVar1,0);
    uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
              &stack0xffffffffffffffb8,data);
    dVar1 = vectorNorm((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       &stack0xffffffffffffffb8);
    uVar5 = SUB84(dVar1,0);
    uVar6 = (undefined4)((ulong)dVar1 >> 0x20);
    break;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)&stack0xffffffffffffffb8,data);
    if ((pointer)uStack_40 == (pointer)0x0) {
      *val = true;
LAB_00201f91:
      iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffffb8,"value");
      if ((((iVar3 == 0) || ((pointer)uStack_40 == (pointer)0x0)) && ((double)local_28 == 0.0)) &&
         (!NAN((double)local_28))) {
        *val = false;
      }
    }
    else {
      val_00._M_str = (char *)in_stack_ffffffffffffffb8;
      val_00._M_len = 0x201f59;
      bVar2 = helicsBoolValue(val_00);
      *val = bVar2;
      if (bVar2) goto LAB_00201f91;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffb8 == &local_38) {
      return;
    }
    uVar4 = local_38._M_allocated_capacity + 1;
    goto LAB_00201fd7;
  case HELICS_BOOL:
    uVar7 = 0.0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)&stack0xffffffffffffffb8)
    ;
    bVar2 = true;
    if ((double)uVar7 == 4.94065645841247e-324) {
      bVar2 = cRam0000000000000000 != '0';
    }
    goto LAB_00201f8a;
  default:
    goto switchD_00201dd5_default;
  }
  *val = (double)CONCAT44(uVar6,uVar5) != 0.0;
  if ((double)in_stack_ffffffffffffffb8 == 0.0) {
    return;
  }
  uVar4 = local_38._M_allocated_capacity - in_stack_ffffffffffffffb8;
LAB_00201fd7:
  operator_delete((void *)in_stack_ffffffffffffffb8,uVar4);
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, bool& val)
{
    switch (baseType) {
        case DataType::HELICS_ANY: {
            defV val_dv;
            valueExtract(data, baseType, val_dv);
            valueExtract(val_dv, val);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default:
            val = helicsBoolValue(ValueConverter<std::string_view>::interpret(data));
            break;
        case DataType::HELICS_BOOL:
            val = (ValueConverter<std::string_view>::interpret(data) != "0");
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            auto& str = npval.name;
            val = str.empty() || helicsBoolValue(str);
            if (val) {
                if ((str == "value" || str.empty()) && npval.value == 0.0) {
                    val = false;
                }
            }

            break;
        }
        case DataType::HELICS_DOUBLE: {
            auto value = ValueConverter<double>::interpret(data);
            val = std::abs(value) != 0;
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto value = ValueConverter<int64_t>::interpret(data);
            val = (value != 0);
            break;
        }

        case DataType::HELICS_VECTOR: {
            auto value = ValueConverter<std::vector<double>>::interpret(data);
            val = (vectorNorm(value) != 0.0);
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto value = ValueConverter<std::complex<double>>::interpret(data);
            val = (std::abs(value) != 0.0);
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto value = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = (vectorNorm(value) != 0.0);
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
        case DataType::HELICS_CUSTOM:
            throw(std::invalid_argument("unrecognized helics type"));
    }
}